

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::append_data
          (section_impl<ELFIO::Elf64_Shdr> *this,char *raw_data,Elf_Word size)

{
  char *__src;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar2 = (*(this->super_section)._vptr_section[5])();
  if (iVar2 == 8) {
    return;
  }
  iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
  if (CONCAT44(extraout_var,iVar2) + (ulong)size < (ulong)this->data_size) {
    pcVar3 = this->data;
    iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
    if (size != 0) {
      memmove(pcVar3 + CONCAT44(extraout_var_00,iVar2),raw_data,(ulong)size);
    }
  }
  else {
    uVar1 = (this->data_size + size) * 2;
    this->data_size = uVar1;
    pcVar3 = (char *)operator_new__((ulong)uVar1);
    if (pcVar3 != (char *)0x0) {
      __src = this->data;
      iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
      if (CONCAT44(extraout_var_01,iVar2) != 0) {
        memmove(pcVar3,__src,CONCAT44(extraout_var_01,iVar2));
      }
      iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
      if (size != 0) {
        memmove(pcVar3 + CONCAT44(extraout_var_02,iVar2),raw_data,(ulong)size);
      }
      if (this->data != (char *)0x0) {
        operator_delete__(this->data);
      }
      this->data = pcVar3;
    }
  }
  iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
  (*(this->super_section)._vptr_section[0x14])(this,(ulong)size + CONCAT44(extraout_var_03,iVar2));
  return;
}

Assistant:

void
    append_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            if ( get_size() + size < data_size ) {
                std::copy( raw_data, raw_data + size, data + get_size() );
            }
            else {
                data_size = 2*( data_size + size);
                char* new_data;
                try {
                    new_data = new char[data_size];
                } catch (const std::bad_alloc&) {
                    new_data = 0;
                    size     = 0;
                }
                if ( 0 != new_data ) {
                    std::copy( data, data + get_size(), new_data );
                    std::copy( raw_data, raw_data + size, new_data + get_size() );
                    delete [] data;
                    data = new_data;
                }
            }
            set_size( get_size() + size );
        }
    }